

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O3

uint32_t fill_with_sine(float *buf,uint32_t rate,uint32_t channels,uint32_t frames,
                       uint32_t initial_phase)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t uVar3;
  double dVar4;
  uint local_44;
  
  local_44 = initial_phase;
  if (frames != 0) {
    iVar2 = 0;
    uVar3 = 0;
    do {
      if (channels != 0) {
        uVar1 = 0;
        do {
          dVar4 = sin((double)((float)local_44 / (float)rate) * 2764.6016120910645);
          buf[iVar2 + uVar1] = (float)(dVar4 * 0.5);
          uVar1 = uVar1 + 1;
        } while (channels != uVar1);
      }
      local_44 = local_44 + 1;
      uVar3 = uVar3 + 1;
      iVar2 = iVar2 + channels;
    } while (uVar3 != frames);
  }
  return local_44;
}

Assistant:

uint32_t
fill_with_sine(float * buf, uint32_t rate, uint32_t channels, uint32_t frames,
               uint32_t initial_phase)
{
  uint32_t offset = 0;
  for (uint32_t i = 0; i < frames; i++) {
    float p = initial_phase++ / static_cast<float>(rate);
    for (uint32_t j = 0; j < channels; j++) {
      buf[offset++] = 0.5 * sin(440. * 2 * PI * p);
    }
  }
  return initial_phase;
}